

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O1

StringTree *
capnp::compiler::stringLiteralStringTree(StringTree *__return_storage_ptr__,StringPtr chars)

{
  char *pcVar1;
  size_t sVar2;
  char *in_R8;
  ArrayPtr<const_unsigned_char> bytes;
  undefined1 local_3a;
  kj local_39;
  String local_38;
  
  local_39 = (kj)0x22;
  bytes.ptr = chars.content.size_ - 1;
  bytes.size_ = 0;
  kj::_::encodeCEscapeImpl(&local_38,(_ *)chars.content.ptr,bytes,SUB81(in_R8,0));
  local_3a = 0x22;
  kj::strTree<char,kj::String,char>
            (__return_storage_ptr__,&local_39,(char *)&local_38,(String *)&local_3a,in_R8);
  sVar2 = local_38.content.size_;
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

static kj::StringTree stringLiteralStringTree(kj::StringPtr chars) {
  return kj::strTree('"', kj::encodeCEscape(chars), '"');
}